

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_parser.cpp
# Opt level: O1

void __thiscall BmsParser::Parser::ParseHeaderValue(Parser *this,char *str)

{
  string *value;
  string *str_00;
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  BmsRegistArraySet *pBVar5;
  Iterator IVar6;
  Iterator IVar7;
  BmsHeaderTable *this_00;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> *this_01;
  mapped_type *pmVar8;
  byte *__nptr;
  byte *__nptr_00;
  BmsWord pos;
  BmsWord local_5c;
  byte *local_58;
  string local_50;
  
  value = &this->value_;
  pcVar2 = (char *)(this->value_)._M_string_length;
  strlen(str);
  std::__cxx11::string::_M_replace((ulong)value,0,pcVar2,(ulong)str);
  str_00 = &this->key_;
  iVar4 = std::__cxx11::string::compare((char *)str_00);
  if (iVar4 == 0) {
    std::__cxx11::string::_M_replace((ulong)str_00,0,(char *)(this->key_)._M_string_length,0x138225)
    ;
  }
  pBVar5 = BmsBms::GetRegistArraySet(this->bms_);
  IVar6 = BmsRegistArraySet::Begin_abi_cxx11_(pBVar5);
  do {
    pBVar5 = BmsBms::GetRegistArraySet(this->bms_);
    IVar7 = BmsRegistArraySet::End_abi_cxx11_(pBVar5);
    if (IVar6._M_node == IVar7._M_node) {
LAB_00133085:
      iVar4 = std::__cxx11::string::compare((char *)str_00);
      if (iVar4 == 0) {
        __nptr = (byte *)str;
        if ((byte *)str == (byte *)0x0) {
          __nptr = (byte *)0x0;
        }
        else {
          while( true ) {
            bVar1 = *__nptr;
            if (((ulong)bVar1 < 0x21) && ((0x100000201U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
            __nptr = __nptr + 1;
          }
          if (bVar1 == 0) {
            __nptr = (byte *)0x0;
          }
        }
        __nptr_00 = __nptr;
        if (__nptr == (byte *)0x0) {
          __nptr_00 = (byte *)0x0;
        }
        else {
          while( true ) {
            bVar1 = *__nptr_00;
            if (((ulong)bVar1 < 0x21) && ((0x100000201U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
            __nptr_00 = __nptr_00 + 1;
          }
          if (bVar1 == 0) {
            __nptr_00 = (byte *)0x0;
          }
        }
        if ((__nptr == (byte *)0x0) || (__nptr_00 == (byte *)0x0)) {
          WriteLogLine(this,"%d line - Failed to parse #STP (%s)",(ulong)(uint)this->line_,str);
        }
        else {
          local_58 = (byte *)atof((char *)__nptr);
          iVar4 = atoi((char *)__nptr_00);
          this_01 = &BmsBms::GetSTPManager(this->bms_)->stp_;
          local_50._M_dataplus._M_p = (pointer)local_58;
          pmVar8 = std::
                   map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                   ::operator[](this_01,(key_type_conflict *)&local_50);
          *pmVar8 = *pmVar8 + iVar4;
        }
      }
      else {
        this_00 = BmsBms::GetHeaders(this->bms_);
        BmsHeaderTable::Set(this_00,str_00,value);
      }
      return;
    }
    bVar3 = BmsRegistArray::CheckConstruction((string *)(IVar6._M_node + 1),str_00);
    if (bVar3) {
      local_58 = (byte *)str;
      std::__cxx11::string::substr((ulong)&local_50,(ulong)str_00);
      BmsWord::BmsWord(&local_5c,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      BmsRegistArray::Set(*(BmsRegistArray **)(IVar6._M_node + 2),&local_5c,value);
      str = (char *)local_58;
      BmsWord::~BmsWord(&local_5c);
      if (IVar6._M_node != IVar7._M_node) {
        return;
      }
      goto LAB_00133085;
    }
    IVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(IVar6._M_node);
  } while( true );
}

Assistant:

void Parser::ParseHeaderValue(const char* str)
	{
		// regist value or metadata(header) value
		value_.assign(str);
		// #EXBPM behaves same as #BPM
		if (key_ == "EXBPM") key_ = "BPM";
		for (auto it = bms_.GetRegistArraySet().Begin(); it != bms_.GetRegistArraySet().End(); ++it) {
			if (BmsRegistArray::CheckConstruction(it->first, key_)) {
				BmsWord pos(key_.substr(key_.length() - 2));
				it->second->Set(pos, value_);
				return;
			}
		}
		// if proper regist array hadn't found
		// then add to header
		if (key_ == "STP") {
			const char* measure_s_ = ParseSeparator(str);
			const char* time_s_ = ParseSeparator(measure_s_);
			if (!measure_s_ || !time_s_) {
				WriteLogLine("%d line - Failed to parse #STP (%s)", line_, str);
				return;
			}
			double  measure_ = atof(measure_s_);
			int time_ = atoi(time_s_);
			bms_.GetSTPManager().Add(measure_, time_);
		}
		else {
			bms_.GetHeaders().Set(key_, value_);
		}
	}